

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  Enum EVar1;
  string_view sVar2;
  
  if (this->in_function_body != true) {
    return (Result)Ok;
  }
  EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  if (EVar1 == Call) {
    sVar2 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,value);
    if (sVar2._M_len != 0) goto LAB_001124c6;
    EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  }
  if (EVar1 == Throw) {
    sVar2 = BinaryReaderObjdumpBase::GetTagName(&this->super_BinaryReaderObjdumpBase,value);
    if (sVar2._M_len != 0) goto LAB_001124c6;
    EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  }
  if ((EVar1 & ~Nop) == GlobalGet) {
    sVar2 = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,value);
    if (sVar2._M_len != 0) goto LAB_001124c6;
    EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
  }
  if ((1 < EVar1 - LocalGet) ||
     (sVar2 = ObjdumpLocalNames::Get
                        (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->local_names,
                         this->current_function_index,value), sVar2._M_len == 0)) {
    LogOpcode(this,"%d",value);
    return (Result)Ok;
  }
LAB_001124c6:
  LogOpcode(this,"%d <%.*s>",value,(ulong)(uint)sVar2._M_len,sVar2._M_str);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  std::string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if (current_opcode == Opcode::Throw &&
             !(name = GetTagName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::LocalGet ||
              current_opcode == Opcode::LocalSet) &&
             !(name = GetLocalName(current_function_index, value)).empty()) {
    LogOpcode("%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode("%d", value);
  }
  return Result::Ok;
}